

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_utf8_codepoint<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,region *reg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  string *this;
  uint_least32_t codepoint;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  string_type character;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  source_location src;
  string str;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  error_info local_390;
  source_location local_338;
  source_location local_2c0;
  istringstream iss;
  uint auStack_230 [90];
  error_info local_c8;
  error_info local_70;
  
  region::as_string_abi_cxx11_(&str,reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,1,
             0xffffffffffffffff);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&src,_S_in);
  std::__cxx11::string::~string((string *)&src);
  *(uint *)((long)auStack_230 + *(long *)(_iss + -0x18)) =
       *(uint *)((long)auStack_230 + *(long *)(_iss + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<unsigned_int>((uint *)&iss);
  character._M_dataplus._M_p = (pointer)&character.field_2;
  character._M_string_length = 0;
  character.field_2._M_local_buf[0] = '\0';
  if (0x7f < codepoint) {
    if (codepoint < 0x800) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 6) | 0xc0);
    }
    else if (codepoint < 0x10000) {
      if ((codepoint & 0xf800) == 0xd800) {
        source_location::source_location(&src,reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,
                   "toml::parse_utf8_codepoint: [0xD800, 0xDFFF] is not a valid UTF-8",&local_4e9);
        source_location::source_location(&local_2c0,&src);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"here",&local_4ea);
        make_error_info<>(&local_390,&local_468,&local_2c0,&local_488);
        err<toml::error_info>((failure<toml::error_info> *)&local_70,&local_390);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_70);
        error_info::~error_info(&local_70);
        error_info::~error_info(&local_390);
        std::__cxx11::string::~string((string *)&local_488);
        source_location::~source_location(&local_2c0);
        this = &local_468;
LAB_0032a3b7:
        std::__cxx11::string::~string((string *)this);
        source_location::~source_location(&src);
        goto LAB_0032a155;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 0xc) | 0xe0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 6) & 0x3f | 0x80);
    }
    else {
      if (0x10ffff < codepoint) {
        source_location::source_location(&src,reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"toml::parse_utf8_codepoint: input codepoint is too large.",
                   &local_4e9);
        source_location::source_location(&local_338,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c8,"must be in range [0x00, 0x10FFFF]",&local_4ea);
        make_error_info<>(&local_390,&local_4a8,&local_338,&local_4c8);
        err<toml::error_info>((failure<toml::error_info> *)&local_c8,&local_390);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_c8);
        error_info::~error_info(&local_c8);
        error_info::~error_info(&local_390);
        std::__cxx11::string::~string((string *)&local_4c8);
        source_location::~source_location(&local_338);
        this = &local_4a8;
        goto LAB_0032a3b7;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 0x12) | 0xf0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 0xc) & 0x3f | 0x80);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
                (byte)(codepoint >> 6) & 0x3f | 0x80);
    }
    codepoint = (uint_least32_t)((byte)codepoint & 0x3f | 0x80);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&character,
             (char)codepoint);
  ok<std::__cxx11::string&>(&local_3b0,(toml *)&character,v);
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  ::result(__return_storage_ptr__,(success_type *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
LAB_0032a155:
  std::__cxx11::string::~string((string *)&character);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&str);
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_utf8_codepoint(const region& reg)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    // assert(reg.as_lines().size() == 1); // XXX heavy check

    const auto str = reg.as_string();
    assert( ! str.empty());
    assert(str.front() == 'u' || str.front() == 'U' || str.front() == 'x');

    std::uint_least32_t codepoint;
    std::istringstream iss(str.substr(1));
    iss >> std::hex >> codepoint;

    const auto to_char = [](const std::uint_least32_t i) noexcept -> char_type {
        const auto uc = static_cast<unsigned char>(i & 0xFF);
        return cxx::bit_cast<char_type>(uc);
    };

    string_type character;
    if(codepoint < 0x80) // U+0000 ... U+0079 ; just an ASCII.
    {
        character += static_cast<char>(codepoint);
    }
    else if(codepoint < 0x800) //U+0080 ... U+07FF
    {
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        character += to_char(0xC0|(codepoint >> 6  ));
        character += to_char(0x80|(codepoint & 0x3F));
    }
    else if(codepoint < 0x10000) // U+0800...U+FFFF
    {
        if(0xD800 <= codepoint && codepoint <= 0xDFFF)
        {
            auto src = source_location(reg);
            return err(make_error_info("toml::parse_utf8_codepoint: "
                "[0xD800, 0xDFFF] is not a valid UTF-8",
                std::move(src), "here"));
        }
        assert(codepoint < 0xD800 || 0xDFFF < codepoint);
        // 1110yyyy 10yxxxxx 10xxxxxx
        character += to_char(0xE0| (codepoint >> 12));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else if(codepoint < 0x110000) // U+010000 ... U+10FFFF
    {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        character += to_char(0xF0| (codepoint >> 18));
        character += to_char(0x80|((codepoint >> 12) & 0x3F));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else // out of UTF-8 region
    {
        auto src = source_location(reg);
        return err(make_error_info("toml::parse_utf8_codepoint: "
            "input codepoint is too large.",
            std::move(src), "must be in range [0x00, 0x10FFFF]"));
    }
    return ok(character);
}